

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyBinaryStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  byte bVar1;
  uint uVar2;
  ushort **ppuVar3;
  int iVar5;
  ushort *puVar6;
  ushort *puVar7;
  ushort *puVar8;
  ushort *puVar9;
  bool bVar10;
  ushort *puVar4;
  
  puVar9 = (ushort *)(zSrc + nLen);
  if (nLen != 0) {
    ppuVar3 = __ctype_b_loc();
    do {
      bVar1 = (byte)*(ushort *)zSrc;
      if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) {
        if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
          bVar10 = bVar1 == 0x2d;
          zSrc = (char *)((long)zSrc + 1);
          goto LAB_0011b7fa;
        }
        break;
      }
      zSrc = (char *)((long)zSrc + 1);
    } while (zSrc < puVar9);
  }
  bVar10 = false;
LAB_0011b7fa:
  puVar4 = puVar9 + -1;
  if (((zSrc < puVar4) && ((byte)*(ushort *)zSrc == 0x30)) &&
     (uVar2 = *(byte *)((long)zSrc + 1) | 0x20, puVar4 = (ushort *)(ulong)uVar2, uVar2 == 0x62)) {
    zSrc = (char *)((long)zSrc + 2);
  }
  for (; (zSrc < puVar9 && ((byte)*(ushort *)zSrc == 0x30)); zSrc = (char *)((long)zSrc + 1)) {
  }
  if (zSrc < puVar9) {
    iVar5 = 3;
    puVar7 = (ushort *)0x0;
    puVar4 = (ushort *)((long)zSrc + 3);
    do {
      puVar8 = puVar4;
      if ((*(byte *)((long)puVar8 + -3) & 0xfe) != 0x30) {
        puVar6 = (ushort *)((long)puVar8 - 3);
        puVar4 = puVar6;
        goto LAB_0011b8fa;
      }
      puVar7 = (ushort *)(((ulong)*(byte *)((long)puVar8 + -3) + (long)puVar7 * 2) - 0x30);
      puVar6 = puVar8 + -1;
      puVar4 = puVar8;
      if (puVar9 <= puVar6) goto LAB_0011b8fa;
      if (((byte)*puVar6 & 0xfe) != 0x30) {
        puVar6 = (ushort *)((long)zSrc + 1);
        goto LAB_0011b8fa;
      }
      puVar7 = (ushort *)(((ulong)(byte)*puVar6 + (long)puVar7 * 2) - 0x30);
      puVar6 = (ushort *)((long)puVar8 - 1);
      if (puVar9 <= puVar6) {
        puVar6 = (ushort *)((long)zSrc + 2);
        goto LAB_0011b8fa;
      }
      if (((((byte)*puVar6 & 0xfe) != 0x30) ||
          (puVar7 = (ushort *)(((ulong)(byte)*puVar6 + (long)puVar7 * 2) - 0x30), puVar6 = puVar8,
          puVar9 <= puVar8)) ||
         ((puVar6 = (ushort *)((long)zSrc + 3), 0x3e < iVar5 || (((byte)*puVar8 & 0xfe) != 0x30))))
      goto LAB_0011b8fa;
      puVar7 = (ushort *)(((ulong)(byte)*puVar8 + (long)puVar7 * 2) - 0x30);
      zSrc = (char *)((long)zSrc + 4);
      puVar4 = puVar8 + 2;
      iVar5 = iVar5 + 4;
    } while ((ushort *)((long)puVar8 + 1) < puVar9);
    puVar6 = (ushort *)((long)puVar8 + 1);
  }
  else {
    puVar7 = (ushort *)0x0;
    puVar6 = (ushort *)zSrc;
  }
LAB_0011b8fa:
  if (puVar6 < puVar9) {
    ppuVar3 = __ctype_b_loc();
    puVar4 = *ppuVar3;
    do {
      puVar8 = (ushort *)((long)puVar6 + 1);
      if ((*(byte *)((long)puVar4 + (long)(char)(byte)*puVar6 * 2 + 1) & 0x20) == 0) break;
      puVar6 = puVar8;
    } while (puVar8 < puVar9);
  }
  if (pOutVal != (void *)0x0) {
    puVar4 = (ushort *)-(long)puVar7;
    if (puVar7 == (ushort *)0x0) {
      puVar4 = puVar7;
    }
    if (!bVar10) {
      puVar4 = puVar7;
    }
    *(ushort **)pOutVal = puVar4;
  }
  return (sxi32)puVar4;
}

Assistant:

JX9_PRIVATE sxi32 SyBinaryStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
	int c;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'b' || zSrc[1] == 'B') ){
		/* Bypass binary prefix */
		zSrc += sizeof(char) * 2;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}